

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::AddMeshes(ASEImporter *this,BaseNode *snode,aiNode *node)

{
  aiColor4D *paVar1;
  aiMesh *paVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint *puVar5;
  aiVector3D *paVar6;
  uint uVar7;
  aiVector3t<float> aVar8;
  BaseNode *local_120;
  BaseNode *local_110;
  undefined8 local_100;
  float local_f8;
  undefined1 local_e4 [8];
  aiMatrix3x3 m3;
  float local_b8;
  aiVector3D *pvEndPtr;
  aiVector3D *pvCurPtr;
  aiMatrix4x4 m;
  Mesh *mesh_1;
  aiMesh *pcMesh_1;
  uint p;
  uint i_1;
  Mesh *mesh;
  aiMesh *pcMesh;
  uint i;
  aiNode *node_local;
  BaseNode *snode_local;
  ASEImporter *this_local;
  
  for (pcMesh._4_4_ = 0; pcMesh._4_4_ < this->pcScene->mNumMeshes; pcMesh._4_4_ = pcMesh._4_4_ + 1)
  {
    paVar1 = this->pcScene->mMeshes[pcMesh._4_4_]->mColors[2];
    local_110 = (BaseNode *)0x0;
    if (paVar1 != (aiColor4D *)0x0) {
      local_110 = (BaseNode *)&paVar1[4].b;
    }
    if (local_110 == snode) {
      node->mNumMeshes = node->mNumMeshes + 1;
    }
  }
  if (node->mNumMeshes != 0) {
    auVar3 = ZEXT416(node->mNumMeshes) * ZEXT816(4);
    uVar4 = auVar3._0_8_;
    if (auVar3._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    puVar5 = (uint *)operator_new__(uVar4);
    node->mMeshes = puVar5;
    pcMesh_1._0_4_ = 0;
    for (pcMesh_1._4_4_ = 0; pcMesh_1._4_4_ < this->pcScene->mNumMeshes;
        pcMesh_1._4_4_ = pcMesh_1._4_4_ + 1) {
      paVar2 = this->pcScene->mMeshes[pcMesh_1._4_4_];
      m._56_8_ = paVar2->mColors[2];
      local_120 = (BaseNode *)0x0;
      if ((aiColor4D *)m._56_8_ != (aiColor4D *)0x0) {
        local_120 = (BaseNode *)&((aiColor4D *)(m._56_8_ + 0x40))->b;
      }
      if (local_120 == snode) {
        uVar7 = (uint)pcMesh_1 + 1;
        node->mMeshes[(uint)pcMesh_1] = pcMesh_1._4_4_;
        memcpy(&pvCurPtr,(aiColor4D *)(m._56_8_ + 0x90),0x40);
        aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&pvCurPtr);
        pvEndPtr = paVar2->mVertices;
        paVar6 = pvEndPtr + paVar2->mNumVertices;
        for (; pvEndPtr != paVar6; pvEndPtr = pvEndPtr + 1) {
          aVar8 = ::operator*((aiMatrix4x4t<float> *)&pvCurPtr,pvEndPtr);
          m3._28_8_ = aVar8._0_8_;
          local_b8 = aVar8.z;
          pvEndPtr->x = m3.c2;
          pvEndPtr->y = m3.c3;
          pvEndPtr->z = local_b8;
          unique0x10000282 = aVar8;
        }
        pcMesh_1._0_4_ = uVar7;
        if (paVar2->mNormals != (aiVector3D *)0x0) {
          aiMatrix3x3t<float>::aiMatrix3x3t
                    ((aiMatrix3x3t<float> *)local_e4,(aiMatrix4x4t<float> *)(m._56_8_ + 0x90));
          aiMatrix3x3t<float>::Transpose((aiMatrix3x3t<float> *)local_e4);
          pvEndPtr = paVar2->mNormals;
          paVar6 = pvEndPtr + paVar2->mNumVertices;
          for (; pvEndPtr != paVar6; pvEndPtr = pvEndPtr + 1) {
            aVar8 = ::operator*((aiMatrix3x3t<float> *)local_e4,pvEndPtr);
            local_100 = aVar8._0_8_;
            local_f8 = aVar8.z;
            pvEndPtr->x = (float)(undefined4)local_100;
            pvEndPtr->y = (float)local_100._4_4_;
            pvEndPtr->z = local_f8;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ASEImporter::AddMeshes(const ASE::BaseNode* snode,aiNode* node)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)   {
        // Get the name of the mesh (the mesh instance has been temporarily stored in the third vertex color)
        const aiMesh* pcMesh  = pcScene->mMeshes[i];
        const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];

        if (mesh == snode) {
            ++node->mNumMeshes;
        }
    }

    if(node->mNumMeshes)    {
        node->mMeshes = new unsigned int[node->mNumMeshes];
        for (unsigned int i = 0, p = 0; i < pcScene->mNumMeshes;++i)    {

            const aiMesh* pcMesh  = pcScene->mMeshes[i];
            const ASE::Mesh* mesh = (const ASE::Mesh*)pcMesh->mColors[2];
            if (mesh == snode)  {
                node->mMeshes[p++] = i;

                // Transform all vertices of the mesh back into their local space ->
                // at the moment they are pretransformed
                aiMatrix4x4 m  = mesh->mTransform;
                m.Inverse();

                aiVector3D* pvCurPtr = pcMesh->mVertices;
                const aiVector3D* pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                while (pvCurPtr != pvEndPtr)    {
                    *pvCurPtr = m * (*pvCurPtr);
                    pvCurPtr++;
                }

                // Do the same for the normal vectors, if we have them.
                // As always, inverse transpose.
                if (pcMesh->mNormals)   {
                    aiMatrix3x3 m3 = aiMatrix3x3( mesh->mTransform );
                    m3.Transpose();

                    pvCurPtr = pcMesh->mNormals;
                    pvEndPtr = pvCurPtr + pcMesh->mNumVertices;
                    while (pvCurPtr != pvEndPtr)    {
                        *pvCurPtr = m3 * (*pvCurPtr);
                        pvCurPtr++;
                    }
                }
            }
        }
    }
}